

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall sqvector<SQClassMember>::~sqvector(sqvector<SQClassMember> *this)

{
  SQClassMember *pSVar1;
  SQUnsignedInteger SVar2;
  ulong uVar3;
  long lVar4;
  
  SVar2 = this->_allocated;
  if (SVar2 != 0) {
    if (this->_size != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        pSVar1 = this->_vals;
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(pSVar1->attrs).super_SQObject._type + lVar4));
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(pSVar1->val).super_SQObject._type + lVar4));
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar3 < this->_size);
      SVar2 = this->_allocated;
    }
    sq_vm_free(this->_vals,SVar2 << 5);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }